

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

void __thiscall CallStatement::print(CallStatement *this)

{
  ostream *poVar1;
  string local_30 [32];
  
  (*(this->super_Function).super_Statement._vptr_Statement[3])(local_30,this);
  poVar1 = std::operator<<((ostream *)&std::cout,local_30);
  std::operator<<(poVar1,"(");
  std::__cxx11::string::~string(local_30);
  if (this->_testlist != (Testlist *)0x0) {
    Testlist::print(this->_testlist);
  }
  std::operator<<((ostream *)&std::cout,")");
  return;
}

Assistant:

void CallStatement::print() {
//    id().print();
    std::cout << id() << "(";
    if(testList() != nullptr) testList()->print();
    std::cout << ")";
}